

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O2

void __thiscall
avro::
PrimitiveSkipper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse(PrimitiveSkipper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,Reader *reader,uint8_t *address)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  ReaderImpl<avro::NullValidator>::readValue(reader,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

virtual void parse(Reader &reader, uint8_t *address) const
    {
        T val;
        reader.readValue(val);
        DEBUG_OUT("Skipping " << val);
    }